

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort.cpp
# Opt level: O2

void mergesort_4way_parallel(uchar **strings,size_t n,uchar **tmp)

{
  long lVar1;
  ostream *poVar2;
  size_t depth;
  ulong uVar3;
  ulong n_00;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar2 = std::operator<<(poVar2,"mergesort_4way_parallel");
  poVar2 = std::operator<<(poVar2,"(), n=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"\n");
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  n_00 = n >> 2;
  uVar3 = n >> 1;
  lVar1 = n_00 + uVar3;
  mergesort_4way_parallel(strings,n_00,tmp);
  mergesort_4way_parallel(strings + n_00,uVar3 - n_00,tmp + n_00);
  mergesort_4way_parallel(strings + uVar3,n_00,tmp + uVar3);
  mergesort_4way_parallel(strings + lVar1,n - lVar1,tmp + lVar1);
  merge_4way(strings,n_00,strings + n_00,uVar3 - n_00,strings + uVar3,n_00,strings + lVar1,n - lVar1
             ,tmp);
  memcpy(strings,tmp,n << 3);
  return;
}

Assistant:

void
mergesort_4way_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	debug() << __func__ << "(), n="<<n<<"\n";
	if (n < 32) {
		insertion_sort(strings, n, 0);
		return;
	}
	const size_t split0 = n/4,
	             split1 = n/2,
	             split2 = split0+split1;
#pragma omp parallel sections
	{
#pragma omp section
		mergesort_4way_parallel(strings,        split0,        tmp);
#pragma omp section
		mergesort_4way_parallel(strings+split0, split1-split0, tmp+split0);
#pragma omp section
		mergesort_4way_parallel(strings+split1, split2-split1, tmp+split1);
#pragma omp section
		mergesort_4way_parallel(strings+split2, n-split2,      tmp+split2);
	}
	merge_4way(strings,        split0,
	           strings+split0, split1-split0,
	           strings+split1, split2-split1,
	           strings+split2, n-split2,
	           tmp);
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}